

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=(Option<Catch::TestRunInfo> *this,TestRunInfo *_value)

{
  TestRunInfo *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->nullableValue;
  if ((pTVar1 != (TestRunInfo *)0x0) &&
     (pcVar2 = (pTVar1->name)._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar2 != &(pTVar1->name).field_2)) {
    operator_delete(pcVar2);
  }
  this->nullableValue = (TestRunInfo *)0x0;
  (this->field_1).dummy2 = (_func_void *)((long)&this->field_1 + 0x10);
  pcVar2 = (_value->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->field_1,pcVar2,pcVar2 + (_value->name)._M_string_length);
  this->nullableValue = (TestRunInfo *)&this->field_1;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }